

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
* spvtools::anon_unknown_0::BuildControlFlowGraph
            (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             *__return_storage_ptr__,ControlFlowGraph *cfg)

{
  uint16_t uVar1;
  BlockSuccessors *pBVar2;
  SingleBlock *pSVar3;
  mapped_type mVar4;
  uint32_t uVar5;
  SingleBlock *pSVar6;
  reference pvVar7;
  spv_parsed_instruction_t *psVar8;
  mapped_type *pmVar9;
  size_type sVar10;
  vector<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
  *this;
  uint32_t local_50;
  uint local_4c;
  spv_parsed_instruction_t *psStack_48;
  uint32_t case_index;
  spv_parsed_instruction_t *branch;
  spv_parsed_instruction_t *maybe_merge;
  reference pvStack_30;
  uint32_t id;
  SingleBlock *block;
  size_t index;
  ControlFlowGraph *local_18;
  ControlFlowGraph *cfg_local;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *id_to_index;
  
  index._7_1_ = 0;
  local_18 = cfg;
  cfg_local = (ControlFlowGraph *)__return_storage_ptr__;
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map(__return_storage_ptr__);
  block = (SingleBlock *)0x0;
  while( true ) {
    pSVar3 = block;
    pSVar6 = (SingleBlock *)
             std::
             vector<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
             ::size(&local_18->blocks);
    if (pSVar6 <= pSVar3) {
      return __return_storage_ptr__;
    }
    pvStack_30 = std::
                 vector<spvtools::(anonymous_namespace)::SingleBlock,_std::allocator<spvtools::(anonymous_namespace)::SingleBlock>_>
                 ::operator[](&local_18->blocks,(size_type)block);
    pvVar7 = std::
             vector<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
             ::operator[](&pvStack_30->instructions,0);
    psVar8 = ParsedInstruction::get(pvVar7);
    if (psVar8->opcode != 0xf8) break;
    pvVar7 = std::
             vector<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
             ::operator[](&pvStack_30->instructions,0);
    psVar8 = ParsedInstruction::get(pvVar7);
    maybe_merge._4_4_ = psVar8->result_id;
    mVar4 = (mapped_type)block;
    pmVar9 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](__return_storage_ptr__,(key_type *)((long)&maybe_merge + 4));
    *pmVar9 = mVar4;
    sVar10 = std::
             vector<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
             ::size(&pvStack_30->instructions);
    if (2 < sVar10) {
      this = &pvStack_30->instructions;
      sVar10 = std::
               vector<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
               ::size(this);
      pvVar7 = std::
               vector<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
               ::operator[](this,sVar10 - 2);
      branch = ParsedInstruction::get(pvVar7);
      if (branch->opcode == 0xf6) {
        uVar5 = GetOperand(branch,0);
        (pvStack_30->successors).merge_block_id = uVar5;
        uVar5 = GetOperand(branch,1);
        (pvStack_30->successors).continue_block_id = uVar5;
      }
      else if (branch->opcode == 0xf7) {
        uVar5 = GetOperand(branch,0);
        (pvStack_30->successors).merge_block_id = uVar5;
      }
    }
    sVar10 = std::
             vector<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
             ::size(&pvStack_30->instructions);
    if (sVar10 < 2) {
      __assert_fail("block.instructions.size() >= 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/disassemble.cpp"
                    ,0x110,
                    "std::unordered_map<uint32_t, uint32_t> spvtools::(anonymous namespace)::BuildControlFlowGraph(ControlFlowGraph &)"
                   );
    }
    pvVar7 = std::
             vector<spvtools::(anonymous_namespace)::ParsedInstruction,_std::allocator<spvtools::(anonymous_namespace)::ParsedInstruction>_>
             ::back(&pvStack_30->instructions);
    psStack_48 = ParsedInstruction::get(pvVar7);
    uVar1 = psStack_48->opcode;
    if (uVar1 == 0xf9) {
      if ((pvStack_30->successors).merge_block_id == 0) {
        uVar5 = GetOperand(psStack_48,0);
        (pvStack_30->successors).next_block_id = uVar5;
      }
      else {
        uVar5 = GetOperand(psStack_48,0);
        (pvStack_30->successors).body_block_id = uVar5;
      }
    }
    else if (uVar1 == 0xfa) {
      uVar5 = GetOperand(psStack_48,1);
      (pvStack_30->successors).true_block_id = uVar5;
      uVar5 = GetOperand(psStack_48,2);
      (pvStack_30->successors).false_block_id = uVar5;
    }
    else if (uVar1 == 0xfb) {
      for (local_4c = 1; local_4c < psStack_48->num_operands; local_4c = local_4c + 2) {
        pBVar2 = &pvStack_30->successors;
        local_50 = GetOperand(psStack_48,local_4c);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&pBVar2->case_block_ids,&local_50);
      }
    }
    block = (SingleBlock *)((long)&block->byte_offset + 1);
  }
  __assert_fail("static_cast<spv::Op>(block.instructions[0].get()->opcode) == spv::Op::OpLabel",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/disassemble.cpp"
                ,0xf5,
                "std::unordered_map<uint32_t, uint32_t> spvtools::(anonymous namespace)::BuildControlFlowGraph(ControlFlowGraph &)"
               );
}

Assistant:

std::unordered_map<uint32_t, uint32_t> BuildControlFlowGraph(
    ControlFlowGraph& cfg) {
  std::unordered_map<uint32_t, uint32_t> id_to_index;

  for (size_t index = 0; index < cfg.blocks.size(); ++index) {
    SingleBlock& block = cfg.blocks[index];

    // For future use, build the ID->index map
    assert(static_cast<spv::Op>(block.instructions[0].get()->opcode) ==
           spv::Op::OpLabel);
    const uint32_t id = block.instructions[0].get()->result_id;

    id_to_index[id] = static_cast<uint32_t>(index);

    // Look for a merge instruction first.  The function of OpBranch depends on
    // that.
    if (block.instructions.size() >= 3) {
      const spv_parsed_instruction_t* maybe_merge =
          block.instructions[block.instructions.size() - 2].get();

      switch (static_cast<spv::Op>(maybe_merge->opcode)) {
        case spv::Op::OpLoopMerge:
          block.successors.merge_block_id = GetOperand(maybe_merge, 0);
          block.successors.continue_block_id = GetOperand(maybe_merge, 1);
          break;

        case spv::Op::OpSelectionMerge:
          block.successors.merge_block_id = GetOperand(maybe_merge, 0);
          break;

        default:
          break;
      }
    }

    // Then look at the last instruction; it must be a branch
    assert(block.instructions.size() >= 2);

    const spv_parsed_instruction_t* branch = block.instructions.back().get();
    switch (static_cast<spv::Op>(branch->opcode)) {
      case spv::Op::OpBranch:
        if (block.successors.merge_block_id != 0) {
          block.successors.body_block_id = GetOperand(branch, 0);
        } else {
          block.successors.next_block_id = GetOperand(branch, 0);
        }
        break;

      case spv::Op::OpBranchConditional:
        block.successors.true_block_id = GetOperand(branch, 1);
        block.successors.false_block_id = GetOperand(branch, 2);
        break;

      case spv::Op::OpSwitch:
        for (uint32_t case_index = 1; case_index < branch->num_operands;
             case_index += 2) {
          block.successors.case_block_ids.push_back(
              GetOperand(branch, case_index));
        }
        break;

      default:
        break;
    }
  }

  return id_to_index;
}